

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

string * RdbufMove(string *__return_storage_ptr__,string *FileName)

{
  streambuf *psVar1;
  string local_3c8 [48];
  ostringstream local_398 [8];
  ostringstream Results;
  undefined1 local_220 [8];
  ifstream ResultReader;
  string *FileName_local;
  
  std::ifstream::ifstream(local_220,(string *)FileName,_S_in);
  std::__cxx11::ostringstream::ostringstream(local_398);
  psVar1 = (streambuf *)std::ifstream::rdbuf();
  std::ostream::operator<<(local_398,psVar1);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_3c8);
  std::__cxx11::string::~string(local_3c8);
  std::__cxx11::ostringstream::~ostringstream(local_398);
  std::ifstream::~ifstream(local_220);
  return __return_storage_ptr__;
}

Assistant:

std::string RdbufMove(std::string FileName)
{
    std::ifstream ResultReader(FileName);
    std::ostringstream Results;
    Results << ResultReader.rdbuf();
    return std::move(Results.str());
}